

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

logical pnga_compare_distr(Integer g_a,Integer g_b)

{
  long in_RSI;
  long in_RDI;
  char err_string_3 [256];
  char err_string_2 [256];
  char err_string_1 [256];
  char err_string [256];
  int i;
  int h_b_maplen;
  int h_a_maplen;
  int h_b;
  int h_a;
  char acStackY_438 [256];
  char local_338 [160];
  Integer in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  char local_238 [256];
  char local_138 [268];
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  long local_10;
  logical local_8;
  
  local_1c = (int)in_RDI + 1000;
  local_20 = (int)in_RSI + 1000;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_24 = calc_maplen(local_1c);
  local_28 = calc_maplen(local_20);
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if ((local_10 + 1000 < 0) || ((long)_max_global_array <= local_10 + 1000)) {
    sprintf(local_138,"%s: INVALID ARRAY HANDLE","distribution a");
    pnga_error(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  }
  if (GA[local_10 + 1000].actv == 0) {
    sprintf(local_238,"%s: ARRAY NOT ACTIVE","distribution a");
    pnga_error(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  }
  if ((local_18 + 1000 < 0) || ((long)_max_global_array <= local_18 + 1000)) {
    sprintf(local_338,"%s: INVALID ARRAY HANDLE","distribution b");
    pnga_error(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  }
  if (GA[local_18 + 1000].actv == 0) {
    sprintf(acStackY_438,"%s: ARRAY NOT ACTIVE","distribution b");
    pnga_error(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  }
  if (GA[local_1c].ndim == GA[local_20].ndim) {
    for (local_2c = 0; local_2c < GA[local_1c].ndim; local_2c = local_2c + 1) {
      if (GA[local_1c].dims[local_2c] != GA[local_20].dims[local_2c]) {
        return 0;
      }
    }
    if (GA[local_1c].distr_type == GA[local_20].distr_type) {
      if (GA[local_1c].distr_type == 0) {
        if (local_24 != local_28) {
          return 0;
        }
        for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
          if (GA[local_1c].mapc[local_2c] != GA[local_20].mapc[local_2c]) {
            return 0;
          }
          if (GA[local_1c].mapc[local_2c] == -1) break;
        }
      }
      else if (((GA[local_1c].distr_type == 1) || (GA[local_1c].distr_type == 2)) ||
              (GA[local_1c].distr_type == 3)) {
        for (local_2c = 0; local_2c < GA[local_1c].ndim; local_2c = local_2c + 1) {
          if (GA[local_1c].block_dims[local_2c] != GA[local_20].block_dims[local_2c]) {
            return 0;
          }
        }
        for (local_2c = 0; local_2c < GA[local_1c].ndim; local_2c = local_2c + 1) {
          if (GA[local_1c].num_blocks[local_2c] != GA[local_20].num_blocks[local_2c]) {
            return 0;
          }
        }
        if ((GA[local_1c].distr_type == 2) || (GA[local_1c].distr_type == 3)) {
          for (local_2c = 0; local_2c < GA[local_1c].ndim; local_2c = local_2c + 1) {
            if (GA[local_1c].nblock[local_2c] != GA[local_20].nblock[local_2c]) {
              return 0;
            }
          }
        }
      }
      else if (GA[local_1c].distr_type == 4) {
        if (local_24 != local_28) {
          return 0;
        }
        for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
          if (GA[local_1c].mapc[local_2c] != GA[local_20].mapc[local_2c]) {
            return 0;
          }
          if (GA[local_1c].mapc[local_2c] == -1) break;
        }
        for (local_2c = 0; local_2c < GA[local_1c].ndim; local_2c = local_2c + 1) {
          if (GA[local_1c].nblock[local_2c] != GA[local_20].nblock[local_2c]) {
            return 0;
          }
        }
      }
      if (GA[local_1c].num_rstrctd == GA[local_20].num_rstrctd) {
        if (0 < GA[local_1c].num_rstrctd) {
          for (local_2c = 0; (long)local_2c < GA[local_1c].num_rstrctd; local_2c = local_2c + 1) {
            if (GA[local_1c].rstrctd_list[local_2c] != GA[local_20].rstrctd_list[local_2c]) {
              return 0;
            }
          }
        }
        local_8 = 1;
      }
      else {
        local_8 = 0;
      }
    }
    else {
      local_8 = 0;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

logical pnga_compare_distr(Integer g_a, Integer g_b)
{
int h_a =(int)g_a + GA_OFFSET;
int h_b =(int)g_b + GA_OFFSET;
int h_a_maplen = calc_maplen(h_a);
int h_b_maplen = calc_maplen(h_b);
int i;

   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   ga_check_handleM(g_a, "distribution a");
   ga_check_handleM(g_b, "distribution b");
   

   if(GA[h_a].ndim != GA[h_b].ndim) return FALSE; 

   for(i=0; i <GA[h_a].ndim; i++)
       if(GA[h_a].dims[i] != GA[h_b].dims[i]) return FALSE;

   if (GA[h_a].distr_type != GA[h_b].distr_type) return FALSE;
   if (GA[h_a].distr_type == REGULAR) {
     if (h_a_maplen != h_b_maplen) return FALSE;
     for(i=0; i <h_a_maplen; i++){
       if(GA[h_a].mapc[i] != GA[h_b].mapc[i]) return FALSE;
       if(GA[h_a].mapc[i] == -1) break;
     }
   } else if (GA[h_a].distr_type == BLOCK_CYCLIC ||
       GA[h_a].distr_type == SCALAPACK || GA[h_a].distr_type == TILED) {
     for (i=0; i<GA[h_a].ndim; i++) {
       if (GA[h_a].block_dims[i] != GA[h_b].block_dims[i]) return FALSE;
     }
     for (i=0; i<GA[h_a].ndim; i++) {
       if (GA[h_a].num_blocks[i] != GA[h_b].num_blocks[i]) return FALSE;
     }
     if (GA[h_a].distr_type == SCALAPACK || GA[h_a].distr_type == TILED) {
       for (i=0; i<GA[h_a].ndim; i++) {
         if (GA[h_a].nblock[i] != GA[h_b].nblock[i]) return FALSE;
       }
     }
   } else if (GA[h_a].distr_type == TILED_IRREG) {
     if (h_a_maplen != h_b_maplen) return FALSE;
     for(i=0; i <h_a_maplen; i++){
       if(GA[h_a].mapc[i] != GA[h_b].mapc[i]) return FALSE;
       if(GA[h_a].mapc[i] == -1) break;
     }
     for (i=0; i<GA[h_a].ndim; i++) {
       if (GA[h_a].nblock[i] != GA[h_b].nblock[i]) return FALSE;
     }
   }
   if (GA[h_a].num_rstrctd == GA[h_b].num_rstrctd) {
     if (GA[h_a].num_rstrctd > 0) {
       for (i=0; i<GA[h_a].num_rstrctd; i++) {
         if (GA[h_a].rstrctd_list[i] != GA[h_b].rstrctd_list[i]) return FALSE;
       }
     }
   } else {
     return FALSE;
   }
   return TRUE;
}